

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLOutput.cpp
# Opt level: O0

void __thiscall Test::XMLOutput::~XMLOutput(XMLOutput *this)

{
  XMLOutput *this_local;
  
  (this->super_CollectorOutput).super_Output._vptr_Output = (_func_int **)&PTR__XMLOutput_001a1b48;
  std::operator<<(this->output,"</testsuites>\n");
  std::ostream::flush();
  std::
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(&this->fileStream);
  CollectorOutput::~CollectorOutput(&this->super_CollectorOutput);
  return;
}

Assistant:

XMLOutput::~XMLOutput() noexcept {
  output << "</testsuites>\n";
  output.flush();
}